

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O0

void keccak_pi(uint64_t *A)

{
  uint64_t uVar1;
  uint64_t A1;
  uint64_t *A_local;
  
  uVar1 = A[1];
  A[1] = A[6];
  A[6] = A[9];
  A[9] = A[0x16];
  A[0x16] = A[0xe];
  A[0xe] = A[0x14];
  A[0x14] = A[2];
  A[2] = A[0xc];
  A[0xc] = A[0xd];
  A[0xd] = A[0x13];
  A[0x13] = A[0x17];
  A[0x17] = A[0xf];
  A[0xf] = A[4];
  A[4] = A[0x18];
  A[0x18] = A[0x15];
  A[0x15] = A[8];
  A[8] = A[0x10];
  A[0x10] = A[5];
  A[5] = A[3];
  A[3] = A[0x12];
  A[0x12] = A[0x11];
  A[0x11] = A[0xb];
  A[0xb] = A[7];
  A[7] = A[10];
  A[10] = uVar1;
  return;
}

Assistant:

static void keccak_pi(uint64_t *A)
{
	uint64_t A1;
	A1 = A[1];
	A[ 1] = A[ 6];
	A[ 6] = A[ 9];
	A[ 9] = A[22];
	A[22] = A[14];
	A[14] = A[20];
	A[20] = A[ 2];
	A[ 2] = A[12];
	A[12] = A[13];
	A[13] = A[19];
	A[19] = A[23];
	A[23] = A[15];
	A[15] = A[ 4];
	A[ 4] = A[24];
	A[24] = A[21];
	A[21] = A[ 8];
	A[ 8] = A[16];
	A[16] = A[ 5];
	A[ 5] = A[ 3];
	A[ 3] = A[18];
	A[18] = A[17];
	A[17] = A[11];
	A[11] = A[ 7];
	A[ 7] = A[10];
	A[10] = A1;
	/* note: A[ 0] is left as is */
}